

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_red.c
# Opt level: O1

void ppRedPentanomial(word *a,pp_pentanom_st *p)

{
  ulong *puVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  
  uVar13 = p->m;
  bVar3 = (byte)uVar13 & 0x3f;
  uVar15 = uVar13 - p->l1;
  uVar14 = uVar13 >> 6;
  bVar4 = (byte)uVar15 & 0x3f;
  uVar16 = uVar15 >> 6;
  uVar7 = uVar13 - p->l;
  bVar5 = (byte)uVar7 & 0x3f;
  uVar11 = uVar13 - p->k;
  uVar8 = uVar7 >> 6;
  bVar6 = (byte)uVar11 & 0x3f;
  uVar12 = uVar11 >> 6;
  uVar10 = (uVar13 + 0x3f >> 6) * 2 - 1;
  if (uVar14 < uVar10) {
    do {
      uVar2 = a[uVar10];
      uVar9 = uVar2 << (0x40 - bVar3 & 0x3f);
      if ((uVar13 & 0x3f) == 0) {
        uVar9 = 0;
      }
      a[(uVar10 - 1) - uVar14] = a[(uVar10 - 1) - uVar14] ^ uVar9;
      a[uVar10 - uVar14] = a[uVar10 - uVar14] ^ uVar2 >> bVar3;
      uVar9 = uVar2 << (0x40 - bVar4 & 0x3f);
      if ((uVar15 & 0x3f) == 0) {
        uVar9 = 0;
      }
      a[(uVar10 - 1) - uVar16] = a[(uVar10 - 1) - uVar16] ^ uVar9;
      a[uVar10 - uVar16] = a[uVar10 - uVar16] ^ uVar2 >> bVar4;
      uVar9 = uVar2 << (0x40 - bVar5 & 0x3f);
      if ((uVar7 & 0x3f) == 0) {
        uVar9 = 0;
      }
      a[(uVar10 - 1) - uVar8] = a[(uVar10 - 1) - uVar8] ^ uVar9;
      a[uVar10 - uVar8] = a[uVar10 - uVar8] ^ uVar2 >> bVar5;
      uVar9 = uVar2 << (0x40 - bVar6 & 0x3f);
      if ((uVar11 & 0x3f) == 0) {
        uVar9 = 0;
      }
      a[(uVar10 - 1) - uVar12] = a[(uVar10 - 1) - uVar12] ^ uVar9;
      a[uVar10 - uVar12] = a[uVar10 - uVar12] ^ uVar2 >> bVar6;
      uVar10 = uVar10 - 1;
    } while (uVar14 < uVar10);
  }
  puVar1 = a + uVar10;
  uVar13 = *puVar1;
  *a = *a ^ uVar13 >> bVar3;
  uVar13 = (uVar13 >> bVar3) << bVar3;
  if (((uVar15 & 0x3f) != 0) && (uVar16 < uVar10)) {
    puVar1[~uVar16] = puVar1[~uVar16] ^ uVar13 << (-bVar4 & 0x3f);
  }
  a[uVar10 - uVar16] = a[uVar10 - uVar16] ^ uVar13 >> bVar4;
  if (((uVar7 & 0x3f) != 0) && (uVar8 < uVar10)) {
    puVar1[~uVar8] = puVar1[~uVar8] ^ uVar13 << (-bVar5 & 0x3f);
  }
  a[uVar10 - uVar8] = a[uVar10 - uVar8] ^ uVar13 >> bVar5;
  if (((uVar11 & 0x3f) != 0) && (uVar12 < uVar10)) {
    puVar1[~uVar12] = puVar1[~uVar12] ^ uVar13 << (-bVar6 & 0x3f);
  }
  a[uVar10 - uVar12] = a[uVar10 - uVar12] ^ uVar13 >> bVar6;
  a[uVar10] = a[uVar10] ^ uVar13;
  return;
}

Assistant:

void ppRedPentanomial(word a[], const pp_pentanom_st* p)
{
	register word hi;
	size_t mb, mw, l1b, l1w, lb, lw, kb, kw;
	size_t n;
	// pre
	ASSERT(memIsValid(p, sizeof(pp_pentanom_st)));
	ASSERT(wwIsValid(a, 2 * W_OF_B(p->m)));
	ASSERT(p->m > p->k && p->k > p->l && p->l > p->l1 && p->l1 > 0);
	ASSERT(p->k < B_PER_W);
	ASSERT(p->m - p->k >= B_PER_W);
	// разбор пятичлена
	mb = p->m % B_PER_W;
	mw = p->m / B_PER_W;
	l1b = (p->m - p->l1) % B_PER_W;
	l1w = (p->m - p->l1) / B_PER_W;
	lb = (p->m - p->l) % B_PER_W;
	lw = (p->m - p->l) / B_PER_W;
	kb = (p->m - p->k) % B_PER_W;
	kw = (p->m - p->k) / B_PER_W;
	// обрабатываем старшие слова
	for (n = 2 * W_OF_B(p->m); --n > mw;)
	{
		hi = a[n];
		a[n - mw - 1] ^= mb ? hi << (B_PER_W - mb) : 0;
		a[n - mw] ^= hi >> mb;
		a[n - l1w - 1] ^= l1b ? hi << (B_PER_W - l1b) : 0;
		a[n - l1w] ^= hi >> l1b;
		a[n - lw - 1] ^= lb ? hi << (B_PER_W - lb) : 0;
		a[n - lw] ^= hi >> lb;
		a[n - kw - 1] ^= kb ? hi << (B_PER_W - kb) : 0;
		a[n - kw] ^= hi >> kb;
	}
	// слово, на которое попадает моном x^m
	ASSERT(n == mw);
	hi = a[n] >> mb;
	a[0] ^= hi;
	hi <<= mb;
	if (l1w < n && l1b)
		a[n - l1w - 1] ^= hi << (B_PER_W - l1b);
	a[n - l1w] ^= hi >> l1b;
	if (lw < n && lb)
		a[n - lw - 1] ^= hi << (B_PER_W - lb);
	a[n - lw] ^= hi >> lb;
	if (kw < n && kb)
		a[n - kw - 1] ^= hi << (B_PER_W - kb);
	a[n - kw] ^= hi >> kb;
	a[n] ^= hi;
	// очистка
	hi = 0;
}